

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

void __thiscall Tree::BuildVirtualFolder(Tree *this,string *virtualFolders)

{
  pointer this_00;
  allocator local_51;
  string local_50;
  
  std::__cxx11::string::append((char *)virtualFolders);
  for (this_00 = (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
                 super__Vector_impl_data._M_start;
      this_00 !=
      (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
      super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
    std::__cxx11::string::string((string *)&local_50,"",&local_51);
    BuildVirtualFolderImpl(this_00,virtualFolders,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::append((char *)virtualFolders);
  return;
}

Assistant:

void Tree::BuildVirtualFolder(std::string& virtualFolders) const
{
  virtualFolders += "<Option virtualFolders=\"CMake Files\\;";
  for (std::vector<Tree>::const_iterator it = folders.begin();
     it != folders.end();
     ++it)
    {
    it->BuildVirtualFolderImpl(virtualFolders, "");
    }
  virtualFolders += "\" />";
}